

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlistview.cpp
# Opt level: O3

void __thiscall QListViewPrivate::prepareItemsLayout(QListViewPrivate *this)

{
  Representation *pRVar1;
  QPersistentModelIndex *this_00;
  QWidget *this_01;
  QAbstractItemModel *pQVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  QSize QVar7;
  QStyle *pQVar8;
  ulong uVar9;
  long in_FS_OFFSET;
  QStyleOption option;
  QModelIndex local_90;
  undefined1 local_78 [16];
  totally_ordered_wrapper<const_QAbstractItemModel_*> local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  QPalettePrivate *pQStack_50;
  undefined1 *local_48;
  QObject *pQStack_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_01 = *(QWidget **)
             &(this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
              super_QFramePrivate.super_QWidgetPrivate.field_0x8;
  (this->cachedItemSize).wd = -1;
  (this->cachedItemSize).ht = -1;
  (*this->commonListView->_vptr_QCommonListViewBase[5])();
  QVar7 = QAbstractScrollArea::maximumViewportSize((QAbstractScrollArea *)this_01);
  (this->layoutBounds).x1 = 0;
  (this->layoutBounds).y1 = 0;
  (this->layoutBounds).x2.m_i = QVar7.wd.m_i.m_i + -1;
  (this->layoutBounds).y2.m_i = QVar7.ht.m_i.m_i + -1;
  pQVar8 = QWidget::style(this_01);
  iVar3 = (**(code **)(*(long *)pQVar8 + 0xf0))(pQVar8,0x11,0,this_01,0);
  iVar4 = 0;
  if (iVar3 != 0) {
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_40 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_50 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_68.ptr = (QAbstractItemModel *)&DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QStyleOption::QStyleOption((QStyleOption *)local_78,1,0);
    QStyleOption::initFrom((QStyleOption *)local_78,this_01);
    pQVar8 = QWidget::style(this_01);
    iVar4 = (**(code **)(*(long *)pQVar8 + 0xe0))(pQVar8,5,(QStyleOption *)local_78,this_01);
    iVar4 = iVar4 * 2;
    QStyleOption::~QStyleOption((QStyleOption *)local_78);
  }
  iVar3 = 0;
  if (((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.vbarpolicy ==
       ScrollBarAsNeeded) &&
     ((this->flow == LeftToRight ||
      (iVar3 = 0,
      (((((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.vbar)->
        super_QAbstractSlider).super_QWidget.data)->widget_attributes & 0x8000) != 0)))) {
    pQVar8 = QWidget::style(this_01);
    iVar3 = 0;
    iVar5 = (**(code **)(*(long *)pQVar8 + 0xe0))
                      (pQVar8,0x56,0,
                       (this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.vbar)
    ;
    if (iVar5 == 0) {
      pQVar8 = QWidget::style(this_01);
      iVar3 = (**(code **)(*(long *)pQVar8 + 0xe0))
                        (pQVar8,9,0,
                         (this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.
                         vbar);
      iVar3 = iVar3 + iVar4;
    }
  }
  uVar9 = 0;
  iVar5 = 0;
  if ((this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.hbarpolicy ==
      ScrollBarAsNeeded) {
    pQVar8 = QWidget::style(this_01);
    iVar5 = (**(code **)(*(long *)pQVar8 + 0xe0))
                      (pQVar8,9,0,
                       (this->super_QAbstractItemViewPrivate).super_QAbstractScrollAreaPrivate.hbar)
    ;
    iVar5 = iVar5 + iVar4;
  }
  pRVar1 = &(this->layoutBounds).x2;
  pRVar1->m_i = pRVar1->m_i - iVar3;
  pRVar1 = &(this->layoutBounds).y2;
  pRVar1->m_i = pRVar1->m_i - iVar5;
  pQVar2 = (this->super_QAbstractItemViewPrivate).model;
  this_00 = &(this->super_QAbstractItemViewPrivate).root;
  QPersistentModelIndex::operator_cast_to_QModelIndex((QModelIndex *)local_78,this_00);
  iVar4 = (**(code **)(*(long *)pQVar2 + 0x80))(pQVar2,(QModelIndex *)local_78);
  if (0 < iVar4) {
    pQVar2 = (this->super_QAbstractItemViewPrivate).model;
    QPersistentModelIndex::operator_cast_to_QModelIndex(&local_90,this_00);
    uVar6 = (**(code **)(*(long *)pQVar2 + 0x78))(pQVar2,&local_90);
    uVar9 = (ulong)uVar6;
  }
  (*this->commonListView->_vptr_QCommonListViewBase[6])(this->commonListView,uVar9);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QListViewPrivate::prepareItemsLayout()
{
    Q_Q(QListView);
    clear();

    //take the size as if there were scrollbar in order to prevent scrollbar to blink
    layoutBounds = QRect(QPoint(), q->maximumViewportSize());

    int frameAroundContents = 0;
    if (q->style()->styleHint(QStyle::SH_ScrollView_FrameOnlyAroundContents, nullptr, q)) {
        QStyleOption option;
        option.initFrom(q);
        frameAroundContents = q->style()->pixelMetric(QStyle::PM_DefaultFrameWidth, &option, q) * 2;
    }

    // maximumViewportSize() already takes scrollbar into account if policy is
    // Qt::ScrollBarAlwaysOn but scrollbar extent must be deduced if policy
    // is Qt::ScrollBarAsNeeded
    int verticalMargin = (vbarpolicy == Qt::ScrollBarAsNeeded) && (flow == QListView::LeftToRight || vbar->isVisible())
                        && !q->style()->pixelMetric(QStyle::PM_ScrollView_ScrollBarOverlap, nullptr, vbar)
        ? q->style()->pixelMetric(QStyle::PM_ScrollBarExtent, nullptr, vbar) + frameAroundContents
        : 0;
    int horizontalMargin =  hbarpolicy==Qt::ScrollBarAsNeeded
        ? q->style()->pixelMetric(QStyle::PM_ScrollBarExtent, nullptr, hbar) + frameAroundContents
        : 0;

    layoutBounds.adjust(0, 0, -verticalMargin, -horizontalMargin);

    int rowCount = model->columnCount(root) <= 0 ? 0 : model->rowCount(root);
    commonListView->setRowCount(rowCount);
}